

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int pkey_ctrl_gost(EVP_PKEY *pkey,int op,long arg1,void *arg2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  EVP_PKEY_CTX *ctx;
  char *name;
  EVP_CIPHER *cipher;
  ASN1_STRING *pval;
  ASN1_OBJECT *pAVar4;
  void *pvVar5;
  EVP_PKEY *peer;
  EVP_CIPHER_CTX *pEVar6;
  uchar *penc;
  X509_PUBKEY *pub;
  int iVar7;
  X509_ALGOR *pXVar8;
  bool bVar9;
  int ptype;
  X509_ALGOR *alg1;
  ASN1_BIT_STRING *pubkey;
  X509_ALGOR *pubalg;
  ASN1_OCTET_STRING *ukm;
  X509_ALGOR *alg2;
  X509_ALGOR *alg;
  size_t shared_key_size;
  uchar shared_key [64];
  int local_d4;
  X509_ALGOR *local_d0;
  ASN1_STRING *local_c8;
  X509_ALGOR *local_c0;
  ASN1_STRING *local_b8;
  int local_ac;
  X509_ALGOR *local_a8;
  void *local_a0;
  undefined8 *local_98;
  void *local_90;
  ASN1_OBJECT *local_88;
  size_t local_80;
  ASN1_OBJECT *local_78 [9];
  
  iVar1 = EVP_PKEY_get_base_id();
  local_d0 = (X509_ALGOR *)0x0;
  local_a8 = (X509_ALGOR *)0x0;
  if ((iVar1 - 0x32bU < 7) && ((0x43U >> (iVar1 - 0x32bU & 0x1f) & 1) != 0)) {
    iVar3 = 0x329;
  }
  else if (iVar1 == 0x3d4) {
    iVar3 = 0x3d7;
  }
  else {
    if (iVar1 != 0x3d3) {
      return -1;
    }
    iVar3 = 0x3d6;
  }
  iVar7 = -2;
  switch(op) {
  case 1:
    if (arg1 != 0) {
      return 1;
    }
    PKCS7_SIGNER_INFO_get0_algs((PKCS7_SIGNER_INFO *)arg2,(EVP_PKEY **)0x0,&local_d0,&local_a8);
    goto LAB_0010f76f;
  case 2:
    if (arg1 != 0) {
      return 1;
    }
    pval = encode_gost_algor_params(pkey);
    if (pval == (ASN1_STRING *)0x0) {
      return -1;
    }
    PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2,&local_d0);
    pXVar8 = local_d0;
    iVar1 = EVP_PKEY_get_id(pkey);
    goto LAB_0010f99c;
  case 3:
    *(int *)arg2 = iVar3;
    return 2;
  default:
    goto switchD_0010f686_caseD_4;
  case 5:
    if (arg1 != 0) {
      return 1;
    }
    CMS_SignerInfo_get0_algs
              ((CMS_SignerInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,&local_d0,&local_a8);
LAB_0010f76f:
    pXVar8 = local_d0;
    pAVar4 = OBJ_nid2obj(iVar3);
    X509_ALGOR_set0(pXVar8,pAVar4,5,(void *)0x0);
    pXVar8 = local_a8;
    pAVar4 = OBJ_nid2obj(iVar1);
    X509_ALGOR_set0(pXVar8,pAVar4,5,(void *)0x0);
    return 1;
  case 7:
    ctx = (EVP_PKEY_CTX *)CMS_RecipientInfo_get0_pkey_ctx(arg2);
    if (arg1 != 0) {
      if (ctx == (EVP_PKEY_CTX *)0x0) {
        return 0;
      }
      iVar1 = CMS_RecipientInfo_type((CMS_RecipientInfo *)arg2);
      if (iVar1 == 0) {
        pvVar5 = EVP_PKEY_CTX_get_data(ctx);
        CMS_RecipientInfo_ktri_get0_algs
                  ((CMS_RecipientInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,(X509_ALGOR **)local_78);
        iVar1 = OBJ_obj2nid((ASN1_OBJECT *)local_78[0]->sn);
        if (iVar1 < 0x3d3) {
          if ((iVar1 != 0x32b) && (iVar1 != 0x331)) {
LAB_0010f9d3:
            ERR_GOST_error(0x9d,0x89,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,0x164);
            return 0;
          }
        }
        else if (1 < iVar1 - 0x3d3U) {
          if (iVar1 == 0x49d) {
            *(undefined4 *)((long)pvVar5 + 0x3c) = 0x4a4;
          }
          else {
            if (iVar1 != 0x49f) goto LAB_0010f9d3;
            *(undefined4 *)((long)pvVar5 + 0x3c) = 0x3f5;
          }
          break;
        }
        *(undefined4 *)((long)pvVar5 + 0x3c) = 0x32d;
        break;
      }
      if (iVar1 != 1) {
        ERR_GOST_error(0x9b,0x89,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                       ,0x176);
        return 0;
      }
      local_c0 = (X509_ALGOR *)0x0;
      local_c8 = (ASN1_STRING *)0x0;
      local_80 = 0x40;
      iVar1 = CMS_RecipientInfo_kari_get0_alg(arg2,&local_98,&local_b8);
      bVar9 = true;
      if (((iVar1 != 0) &&
          (iVar1 = CMS_RecipientInfo_kari_get0_orig_id(arg2,&local_c0,&local_c8,0,0,0), iVar1 != 0))
         && (uVar2 = OBJ_obj2nid((ASN1_OBJECT *)*local_98), *(int *)local_98[1] == 0x10)) {
        if ((uVar2 | 2) == 0x49f) {
          name = OBJ_nid2sn(uVar2);
          cipher = EVP_get_cipherbyname(name);
        }
        else {
          cipher = (EVP_CIPHER *)0x0;
        }
        if (cipher == (EVP_CIPHER *)0x0) {
          ERR_GOST_error(0x9c,0x67,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                         ,0x10e);
        }
        else {
          iVar1 = ASN1_STRING_length(local_b8);
          pvVar5 = (void *)ASN1_STRING_get0_data(local_b8);
          iVar1 = EVP_PKEY_CTX_ctrl(ctx,-1,-1,8,iVar1,pvVar5);
          if (0 < iVar1) {
            peer = (EVP_PKEY *)0x0;
            if (local_c8 == (ASN1_STRING *)0x0) {
              pub = (X509_PUBKEY *)0x0;
LAB_0010fb1c:
              iVar1 = EVP_PKEY_derive(ctx,(uchar *)local_78,&local_80);
              if (0 < iVar1) {
                pEVar6 = (EVP_CIPHER_CTX *)CMS_RecipientInfo_kari_get0_ctx(arg2);
                EVP_CIPHER_CTX_set_flags(pEVar6,1);
                pEVar6 = (EVP_CIPHER_CTX *)CMS_RecipientInfo_kari_get0_ctx(arg2);
                iVar1 = EVP_DecryptInit_ex(pEVar6,cipher,(ENGINE *)0x0,(uchar *)local_78,
                                           local_b8->data + 0x18);
                bVar9 = iVar1 == 0;
                uVar2 = (uint)!bVar9;
                goto LAB_0010faf6;
              }
              iVar3 = 0x69;
              iVar1 = 0x139;
            }
            else {
              pub = (X509_PUBKEY *)0x0;
              if (local_c0 == (X509_ALGOR *)0x0) goto LAB_0010fb1c;
              local_78[0] = (ASN1_OBJECT *)0x0;
              local_d4 = 0;
              local_a0 = (void *)0x0;
              peer = EVP_PKEY_new();
              pub = X509_PUBKEY_new();
              if (pub == (X509_PUBKEY *)0x0 || peer == (EVP_PKEY *)0x0) {
                iVar3 = 0xc0100;
                iVar1 = 0x11f;
              }
              else {
                X509_ALGOR_get0(local_78,&local_d4,&local_a0,local_c0);
                local_88 = local_78[0];
                local_ac = local_d4;
                local_90 = local_a0;
                penc = (uchar *)ASN1_STRING_get0_data(local_c8);
                iVar1 = ASN1_STRING_length(local_c8);
                iVar1 = X509_PUBKEY_set0_param(pub,local_88,local_ac,local_90,penc,iVar1);
                if (iVar1 == 0) {
                  iVar3 = 0x7d;
                  iVar1 = 0x129;
                }
                else {
                  iVar1 = pub_decode_gost_ec((EVP_PKEY *)peer,(X509_PUBKEY *)pub);
                  if (iVar1 < 1) {
                    iVar3 = 0x8a;
                    iVar1 = 0x12e;
                  }
                  else {
                    iVar1 = EVP_PKEY_derive_set_peer(ctx,peer);
                    if (0 < iVar1) goto LAB_0010fb1c;
                    iVar3 = 0x8b;
                    iVar1 = 0x133;
                  }
                }
              }
            }
            ERR_GOST_error(0x9c,iVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                           ,iVar1);
            uVar2 = 0;
            goto LAB_0010faf6;
          }
        }
      }
      uVar2 = 0;
      peer = (EVP_PKEY *)0x0;
      pub = (X509_PUBKEY *)0x0;
LAB_0010faf6:
      EVP_PKEY_free(peer);
      if (bVar9) {
        X509_PUBKEY_free(pub);
        return uVar2;
      }
      return uVar2;
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      return 0;
    }
    pvVar5 = EVP_PKEY_CTX_get_data(ctx);
    iVar3 = *(int *)((long)pvVar5 + 0x3c);
    if ((iVar3 == 0x4a4) || (iVar3 == 0x3f5)) {
      iVar1 = (uint)(iVar3 != 0x4a4) * 2 + 0x49d;
      iVar3 = EVP_PKEY_get_base_id(pkey);
      pval = gost_encode_cms_params(iVar3 == 0x3d3 ^ 0x3e1);
    }
    else {
      pval = encode_gost_algor_params(pkey);
    }
    if (pval == (ASN1_STRING *)0x0) {
      return -1;
    }
    CMS_RecipientInfo_ktri_get0_algs
              ((CMS_RecipientInfo *)arg2,(EVP_PKEY **)0x0,(X509 **)0x0,&local_d0);
    pXVar8 = local_d0;
LAB_0010f99c:
    pAVar4 = OBJ_nid2obj(iVar1);
    X509_ALGOR_set0(pXVar8,pAVar4,0x10,pval);
    break;
  case 8:
    *(undefined4 *)arg2 = 0;
    break;
  case 0xb:
    if (1 < (ulong)arg1) {
      return 0;
    }
    *(undefined4 *)arg2 = 1;
  }
  iVar7 = 1;
switchD_0010f686_caseD_4:
  return iVar7;
}

Assistant:

static int pkey_ctrl_gost(EVP_PKEY *pkey, int op, long arg1, void *arg2)
{
    int nid = EVP_PKEY_base_id(pkey), md_nid = NID_undef;
    X509_ALGOR *alg1 = NULL, *alg2 = NULL;

    switch (nid) {
    case NID_id_GostR3410_2012_512:
        md_nid = NID_id_GostR3411_2012_512;
        break;
    case NID_id_GostR3410_2012_256:
        md_nid = NID_id_GostR3411_2012_256;
        break;
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_94:
        md_nid = NID_id_GostR3411_94;
        break;
    default:
        return -1;
    }

    switch (op) {
    case ASN1_PKEY_CTRL_PKCS7_SIGN:
        if (arg1 == 0) {
            PKCS7_SIGNER_INFO_get0_algs((PKCS7_SIGNER_INFO *)arg2, NULL,
                                        &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_SIGN:
        if (arg1 == 0) {
            CMS_SignerInfo_get0_algs((CMS_SignerInfo *)arg2, NULL, NULL,
                                     &alg1, &alg2);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(md_nid), V_ASN1_NULL, 0);
            X509_ALGOR_set0(alg2, OBJ_nid2obj(nid), V_ASN1_NULL, 0);
        }
        return 1;
#endif
    case ASN1_PKEY_CTRL_PKCS7_ENCRYPT:
        if (arg1 == 0) { /* Encryption */
            ASN1_STRING *params = encode_gost_algor_params(pkey);
            if (!params) {
                return -1;
            }
            PKCS7_RECIP_INFO_get0_alg((PKCS7_RECIP_INFO *)arg2, &alg1);
            X509_ALGOR_set0(alg1, OBJ_nid2obj(EVP_PKEY_id(pkey)),
                            V_ASN1_SEQUENCE, params);
				}
        return 1;
#ifndef OPENSSL_NO_CMS
    case ASN1_PKEY_CTRL_CMS_ENVELOPE:
        if (arg1 == 0) {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;

          struct gost_pmeth_data *gctx = NULL;
          ASN1_STRING *params = NULL;

          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
            return 0;

          gctx = EVP_PKEY_CTX_get_data(pctx);

          switch (gctx->cipher_nid) {
            case NID_magma_ctr:
            case NID_kuznyechik_ctr:
              {
                int ka_nid;

                nid = (gctx->cipher_nid == NID_magma_ctr) ? NID_magma_kexp15 :
                  NID_kuznyechik_kexp15;

                ka_nid = (EVP_PKEY_base_id(pkey) == NID_id_GostR3410_2012_256) ?
                  NID_id_tc26_agreement_gost_3410_2012_256 : NID_id_tc26_agreement_gost_3410_2012_512;

                params = gost_encode_cms_params(ka_nid);
              }
              break;
            default:
                params = encode_gost_algor_params(pkey);
              break;
          }

          if (params == NULL)
              return -1;

          CMS_RecipientInfo_ktri_get0_algs((CMS_RecipientInfo *)arg2, NULL,
              NULL, &alg1);
          X509_ALGOR_set0(alg1, OBJ_nid2obj(nid), V_ASN1_SEQUENCE, params);
        } else {
          EVP_PKEY_CTX *pctx;
          CMS_RecipientInfo *ri = arg2;
          pctx = CMS_RecipientInfo_get0_pkey_ctx(ri);
          if (!pctx)
              return 0;
          return gost_cms_set_shared_info(pctx, ri);
        }
        return 1;
#ifdef ASN1_PKEY_CTRL_CMS_RI_TYPE
  case ASN1_PKEY_CTRL_CMS_RI_TYPE:
        *(int *)arg2 = CMS_RECIPINFO_TRANS;
        return 1;
	case ASN1_PKEY_CTRL_CMS_IS_RI_TYPE_SUPPORTED:
			if (arg1 == CMS_RECIPINFO_AGREE || arg1 == CMS_RECIPINFO_TRANS) {
          *(int *)arg2 = 1;
				  return 1;
      }
			else
				  return 0;
			break;
#endif
#endif
    case ASN1_PKEY_CTRL_DEFAULT_MD_NID:
        *(int *)arg2 = md_nid;
        return 2;
    }

    return -2;
}